

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPrimAttrIdentifier(AsciiParser *this,string *token)

{
  ulong uVar1;
  int *piVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char cVar4;
  StreamReader *pSVar5;
  ulong uVar6;
  undefined8 uVar7;
  bool bVar8;
  int iVar9;
  ostream *poVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  long lVar12;
  char *pcVar13;
  ulong uVar14;
  char *pcVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  int iVar16;
  uint8_t unaff_R15B;
  bool bVar17;
  string tok;
  ostringstream ss_e;
  stringstream ss;
  undefined1 local_3b8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_398;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_388;
  string local_378;
  string local_358;
  string *local_338;
  undefined1 local_330 [112];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c0;
  _Alloc_hider local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a0;
  _Alloc_hider local_290;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_280 [12];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_338 = token;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  do {
    pSVar5 = this->_sr;
    uVar14 = pSVar5->length_;
    uVar6 = pSVar5->idx_;
    if ((uVar14 <= uVar6) || (pSVar5->binary_[uVar6] == '\0')) goto LAB_00339afb;
    uVar1 = uVar6 + 1;
    if (uVar1 <= uVar14) {
      unaff_R15B = pSVar5->binary_[uVar6];
      pSVar5->idx_ = uVar1;
    }
    iVar16 = 1;
    if (uVar1 <= uVar14) {
      if (unaff_R15B == '.') {
        ::std::__cxx11::stringbuf::str();
        uVar7 = local_330._8_8_;
        if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
          operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar7 ==
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,"ReadPrimAttrIdentifier",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_330,0x605);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          lVar12 = 0x26;
          pcVar13 = "PrimAttr name must not starts with `.`";
LAB_00339930:
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,pcVar13,lVar12);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)local_3b8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_
              != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_3b8 + 0x10)) {
            operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
          ::std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
          goto LAB_00339a24;
        }
      }
      else if (unaff_R15B != '_') {
        if (unaff_R15B == ':') {
          ::std::__cxx11::stringbuf::str();
          uVar7 = local_330._8_8_;
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar7 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_330,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                       ,0x56);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_330,"ReadPrimAttrIdentifier",0x16);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
            poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_330,0x600);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
            lVar12 = 0x26;
            pcVar13 = "PrimAttr name must not starts with `:`";
            goto LAB_00339930;
          }
        }
        else {
          iVar9 = isalnum((int)(char)unaff_R15B);
          if (iVar9 == 0) {
            iVar16 = 3;
            if ((0 < (long)pSVar5->idx_) && (uVar14 = pSVar5->idx_ - 1, uVar14 <= pSVar5->length_))
            {
              pSVar5->idx_ = uVar14;
            }
            goto LAB_00339a24;
          }
          ::std::__cxx11::stringbuf::str();
          uVar7 = local_330._8_8_;
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar7 ==
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            iVar9 = isalpha((int)(char)unaff_R15B);
            if (iVar9 == 0) {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_330,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                         ,0x56);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_330,"ReadPrimAttrIdentifier",0x16);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
              poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_330,0x60b);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
              lVar12 = 0x2a;
              pcVar13 = "PrimAttr name must not starts with number.";
              goto LAB_00339930;
            }
          }
        }
      }
      piVar2 = &(this->_curr_cursor).col;
      *piVar2 = *piVar2 + 1;
      local_330[0] = unaff_R15B;
      ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_330,1);
      iVar16 = 0;
    }
LAB_00339a24:
  } while (iVar16 == 0);
  if (iVar16 == 3) {
LAB_00339afb:
    local_3b8._0_8_ = local_3b8 + 0x10;
    local_3b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_3b8[0x10] = '\0';
    local_378._M_dataplus._M_p = (pointer)&local_378.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_378,"");
    ::std::__cxx11::stringbuf::str();
    Path::Path((Path *)local_330,&local_378,(string *)&local_398);
    bVar8 = pathutil::ValidatePropPath((Path *)local_330,(string *)local_3b8);
    if (local_290._M_p != local_330 + 0xb0) {
      operator_delete(local_290._M_p,local_280[0]._M_allocated_capacity + 1);
    }
    if (local_2b0._M_p != local_330 + 0x90) {
      operator_delete(local_2b0._M_p,local_2a0._M_allocated_capacity + 1);
    }
    paVar3 = &local_378.field_2;
    if ((undefined1 *)local_330._96_8_ != local_330 + 0x70) {
      operator_delete((void *)local_330._96_8_,local_2c0._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_330._64_8_ != local_330 + 0x50) {
      operator_delete((void *)local_330._64_8_,local_330._80_8_ + 1);
    }
    if ((undefined1 *)local_330._32_8_ != local_330 + 0x30) {
      operator_delete((void *)local_330._32_8_,local_330._48_8_ + 1);
    }
    if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
      operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_398._M_allocated_capacity != &local_388) {
      operator_delete((void *)local_398._M_allocated_capacity,local_388._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_378._M_dataplus._M_p != paVar3) {
      operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
    }
    if (bVar8) {
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
      }
      ::std::__cxx11::stringbuf::str();
      cVar4 = ((pointer)(local_330._0_8_ + -1))[local_330._8_8_];
      if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
        operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
      }
      if (cVar4 != '.') {
        ::std::__cxx11::stringbuf::str();
        lVar12 = ::std::__cxx11::string::find((char)local_3b8,0x2e);
        if (lVar12 == -1) {
LAB_0033a216:
          ::std::__cxx11::stringbuf::str();
          ::std::__cxx11::string::operator=((string *)local_338,(string *)local_330);
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          bVar8 = true;
        }
        else {
          local_330._0_8_ = local_330 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)local_330,".connect","");
          if ((ulong)local_3b8._8_8_ < (ulong)local_330._8_8_) {
            bVar8 = false;
          }
          else {
            lVar12 = ::std::__cxx11::string::find
                               (local_3b8,local_330._0_8_,local_3b8._8_8_ - local_330._8_8_);
            bVar8 = lVar12 != -1;
          }
          bVar17 = true;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    local_330._8_8_;
          if (!bVar8) {
            local_378._M_dataplus._M_p = (pointer)paVar3;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_378,".timeSamples","");
            if ((ulong)local_3b8._8_8_ < local_378._M_string_length) {
              bVar17 = false;
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_378._M_string_length;
            }
            else {
              lVar12 = ::std::__cxx11::string::find
                                 (local_3b8,(ulong)local_378._M_dataplus._M_p,
                                  local_3b8._8_8_ - local_378._M_string_length);
              bVar17 = lVar12 != -1;
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_378._M_string_length;
            }
          }
          if ((!bVar8) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_378._M_dataplus._M_p != paVar3)) {
            operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
          }
          if ((undefined1 *)local_330._0_8_ != local_330 + 0x10) {
            operator_delete((void *)local_330._0_8_,local_330._16_8_ + 1);
          }
          if (bVar17) {
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._8_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
              pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              uVar14 = 0;
              do {
                uVar14 = uVar14 + (*(char *)(local_3b8._0_8_ + (long)pbVar11) == '.');
                pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          ((long)&(pbVar11->_M_dataplus)._M_p + 1);
              } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_3b8._8_8_ != pbVar11);
              if (1 < uVar14) {
                pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_3b8._0_8_;
                ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_330,"[error]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_330,
                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                           ,0x56);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_330,"[ASCII]",7);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
                ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_330,"ReadPrimAttrIdentifier",0x16);
                ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
                poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_330,0x638);
                ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
                pcVar15 = "Attribute identifier `{}` containing multiple `.` is not allowed.";
                pcVar13 = "";
                goto LAB_0033a320;
              }
            }
            goto LAB_0033a216;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                     ,0x56);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[ASCII]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_330,"ReadPrimAttrIdentifier",0x16);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
          poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_330,0x630);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
          pcVar15 = "Must ends with `.connect` or `.timeSamples` for attrbute name: `{}`";
          pcVar13 = "";
LAB_0033a320:
          local_358._M_dataplus._M_p = (pointer)&local_358.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_358,pcVar15,pcVar13);
          fmt::format<std::__cxx11::string>
                    ((string *)&local_398,(fmt *)&local_358,(string *)local_3b8,pbVar11);
          poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_330,(char *)local_398._M_allocated_capacity,
                               local_398._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            local_388._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_358._M_dataplus._M_p != &local_358.field_2) {
            operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_398);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_398._M_allocated_capacity != &local_388) {
            operator_delete((void *)local_398._M_allocated_capacity,
                            local_388._M_allocated_capacity + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
          ::std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
          bVar8 = false;
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b8 + 0x10))
        {
          operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
        }
        goto LAB_00339fd5;
      }
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"ReadPrimAttrIdentifier",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_330,0x623);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"PrimAttr name must not ends with `.`\n",0x25);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_3b8);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
      ::std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_330);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                 ,0x56);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"[ASCII]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_330,"ReadPrimAttrIdentifier",0x16);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_330,"():",3);
      poVar10 = (ostream *)::std::ostream::operator<<((ostringstream *)local_330,0x61d);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
      local_398._M_allocated_capacity = (size_type)&local_388;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_398,"Invalid Property name `{}`: {}","");
      ::std::__cxx11::stringbuf::str();
      fmt::format<std::__cxx11::string,std::__cxx11::string>
                (&local_378,(fmt *)local_398._M_local_buf,&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8,
                 in_R8);
      poVar10 = ::std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_330,local_378._M_dataplus._M_p,
                           local_378._M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_358._M_dataplus._M_p != &local_358.field_2) {
        operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_allocated_capacity != &local_388) {
        operator_delete((void *)local_398._M_allocated_capacity,local_388._M_allocated_capacity + 1)
        ;
      }
      ::std::__cxx11::stringbuf::str();
      PushError(this,&local_378);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_378._M_dataplus._M_p != &local_378.field_2) {
        operator_delete(local_378._M_dataplus._M_p,local_378.field_2._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_330);
      ::std::ios_base::~ios_base((ios_base *)(local_330 + 0x70));
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3b8._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_3b8 + 0x10)) {
        operator_delete((void *)local_3b8._0_8_,CONCAT71(local_3b8._17_7_,local_3b8[0x10]) + 1);
      }
    }
  }
  bVar8 = false;
LAB_00339fd5:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar8;
}

Assistant:

bool AsciiParser::ReadPrimAttrIdentifier(std::string *token) {
  // Example:
  // - xformOp:transform
  // - primvars:uvmap1

  std::stringstream ss;

  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '_') {
      // ok
    } else if (c == ':') {  // namespace
      // ':' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `:`");
      }
    } else if (c == '.') {  // delimiter for `connect`
      // '.' must lie in the middle of string literal
      if (ss.str().size() == 0) {
        PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with `.`");
      }
    } else if (std::isalnum(int(c))) {
      // number must not be allowed for the first char.
      if (ss.str().size() == 0) {
        if (!std::isalpha(int(c))) {
          PUSH_ERROR_AND_RETURN("PrimAttr name must not starts with number.");
        }
      }
    } else {
      _sr->seek_from_current(-1);
      break;
    }

    _curr_cursor.col++;

    ss << c;
  }

  {
    std::string name_err;
    if (!pathutil::ValidatePropPath(Path("", ss.str()), &name_err)) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii,
          fmt::format("Invalid Property name `{}`: {}", ss.str(), name_err));
    }
  }

  // '.' must lie in the middle of string literal
  if (ss.str().back() == '.') {
    PUSH_ERROR_AND_RETURN("PrimAttr name must not ends with `.`\n");
    return false;
  }

  std::string tok = ss.str();

  if (contains(tok, '.')) {
    if (endsWith(tok, ".connect") || endsWith(tok, ".timeSamples")) {
      // OK
    } else {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Must ends with `.connect` or `.timeSamples` for "
                              "attrbute name: `{}`",
                              tok));
    }

    // Multiple `.` is not allowed(e.g. attr.connect.timeSamples)
    if (counts(tok, '.') > 1) {
      PUSH_ERROR_AND_RETURN_TAG(
          kAscii, fmt::format("Attribute identifier `{}` containing multiple "
                              "`.` is not allowed.",
                              tok));
    }
  }

  (*token) = ss.str();
  DCOUT("primAttr identifier = " << (*token));
  return true;
}